

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QPainter * __thiscall QWidget::sharedPainter(QWidget *this)

{
  QWidgetPrivate *pQVar1;
  ulong uVar2;
  QPaintDevice *pQVar3;
  QWidgetPrivate *in_RDI;
  QPainter *sp;
  QPainter *local_8;
  
  pQVar1 = d_func((QWidget *)0x3825ac);
  if (pQVar1->redirectDev == (QPaintDevice *)0x0) {
    local_8 = (QPainter *)0x0;
  }
  else {
    d_func((QWidget *)0x3825cb);
    local_8 = QWidgetPrivate::sharedPainter(in_RDI);
    if ((local_8 == (QPainter *)0x0) || (uVar2 = QPainter::isActive(), (uVar2 & 1) == 0)) {
      local_8 = (QPainter *)0x0;
    }
    else {
      QPainter::paintEngine();
      pQVar3 = (QPaintDevice *)QPaintEngine::paintDevice();
      pQVar1 = d_func((QWidget *)0x382619);
      if (pQVar3 != pQVar1->redirectDev) {
        local_8 = (QPainter *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

QPainter *QWidget::sharedPainter() const
{
    // Someone sent a paint event directly to the widget
    if (!d_func()->redirectDev)
        return nullptr;

    QPainter *sp = d_func()->sharedPainter();
    if (!sp || !sp->isActive())
        return nullptr;

    if (sp->paintEngine()->paintDevice() != d_func()->redirectDev)
        return nullptr;

    return sp;
}